

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

void __thiscall
VideoHppGenerator::readStructMember
          (VideoHppGenerator *this,XMLElement *element,
          vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
          *members)

{
  int line;
  XMLElement *pXVar1;
  pointer pMVar2;
  _Alloc_hider __s2;
  size_type __n;
  vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_> *this_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined8 extraout_RAX;
  size_t __len2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  undefined8 uVar9;
  undefined1 auVar10 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer ppXVar12;
  long *plVar13;
  pointer pMVar14;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string previous;
  string value;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> children;
  XMLElement *childElement_1;
  string next;
  string name;
  XMLElement *childElement;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attributes;
  undefined1 local_298 [8];
  XMLElement **ppXStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Base_ptr local_278;
  size_t local_270;
  undefined1 local_268 [32];
  _Base_ptr local_248;
  size_t local_240;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> local_238;
  undefined8 local_220;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_> *local_138;
  XMLElement **local_130;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  long *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  line = (element->super_XMLNode)._parseLineNum;
  getAttributes_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,element);
  local_128._24_8_ = local_128 + 8;
  local_128._16_8_ = (_Base_ptr)0x0;
  local_128._0_8_ = (XMLElement *)0x0;
  local_128._8_8_ = 0;
  local_100 = (long *)0x0;
  local_208._8_8_ = local_218 + 8;
  local_208._M_allocated_capacity = 0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = 0;
  local_1f8._8_8_ = 0;
  local_1f8._0_8_ = local_208._8_8_;
  local_108 = (undefined1  [8])local_128._24_8_;
  checkAttributes(line,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_60,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_128,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_218);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_218);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_128);
  local_238.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (XMLElement **)0x0;
  local_238.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (XMLElement **)0x0;
  local_238.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (XMLElement **)0x0;
  local_128._0_8_ = tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
  for (; (XMLElement *)local_128._0_8_ != (XMLElement *)0x0;
      local_128._0_8_ =
           tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_128._0_8_,(char *)0x0)) {
    if (local_238.
        super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_238.
        super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
      _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>> *)
                 &local_238,
                 (iterator)
                 local_238.
                 super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(XMLElement **)local_128);
    }
    else {
      *local_238.
       super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = (XMLElement *)local_128._0_8_;
      local_238.
      super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_238.
           super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  pXVar1 = (XMLElement *)(local_128 + 0x10);
  local_128._0_8_ = pXVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"name","");
  local_108[0] = 1;
  plVar13 = (long *)(local_f8._M_local_buf + 8);
  local_100 = plVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"type","");
  local_e8._M_string_length = CONCAT71(local_e8._M_string_length._1_7_,1);
  __l._M_len = 2;
  __l._M_array = (iterator)local_128;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)local_268,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_178,(allocator_type *)&local_198);
  local_218._0_8_ = local_218 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"comment","");
  paVar11 = &local_1e8;
  local_1f8._0_8_ = paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"enum","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_218;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_298,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_1b8,(allocator_type *)&local_158);
  checkElements(line,&local_238,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_268,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_298);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
  lVar8 = -0x40;
  do {
    if (paVar11 !=
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)(paVar11->_M_local_buf + -0x10)) {
      operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(paVar11->_M_local_buf + -0x10),paVar11->_M_allocated_capacity + 1);
    }
    paVar11 = paVar11 + -2;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_138 = members;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_268);
  lVar8 = -0x50;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -5;
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0);
  local_108 = (undefined1  [8])&local_f8;
  local_128._8_8_ = 0;
  local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
  local_100 = (long *)0x0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_90._M_allocated_capacity = (size_type)&local_80;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._8_8_ = 0;
  local_80._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_130 = local_238.
              super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_128._0_8_ = pXVar1;
  local_70 = line;
  if (local_238.
      super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_238.
      super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppXVar12 = local_238.
               super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pXVar1 = *ppXVar12;
      iVar4 = (pXVar1->super_XMLNode)._parseLineNum;
      getAttributes_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_218,pXVar1);
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = 0;
      local_268._16_8_ = (_Base_ptr)0x0;
      local_268._24_8_ = local_268 + 8;
      local_240 = 0;
      local_288._M_allocated_capacity = 0;
      local_298 = (undefined1  [8])0x0;
      ppXStack_290 = (XMLElement **)0x0;
      local_288._8_8_ = &ppXStack_290;
      local_270 = 0;
      local_278 = (_Base_ptr)local_288._8_8_;
      local_248 = (_Base_ptr)local_268._24_8_;
      checkAttributes(iVar4,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_218,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)local_268,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)local_298);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_298);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_268);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_218);
      local_298 = (undefined1  [8])0x0;
      ppXStack_290 = (XMLElement **)0x0;
      local_288._M_allocated_capacity = 0;
      for (local_218._0_8_ =
                tinyxml2::XMLNode::FirstChildElement(&pXVar1->super_XMLNode,(char *)0x0);
          (XMLElement *)local_218._0_8_ != (XMLElement *)0x0;
          local_218._0_8_ =
               tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_218._0_8_,(char *)0x0)) {
        if (ppXStack_290 == (XMLElement **)local_288._M_allocated_capacity) {
          std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
          _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                    ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>
                      *)local_298,(iterator)ppXStack_290,(XMLElement **)local_218);
        }
        else {
          *ppXStack_290 = (XMLElement *)local_218._0_8_;
          ppXStack_290 = ppXStack_290 + 1;
        }
      }
      local_208._M_allocated_capacity = 0;
      local_218._0_8_ = (pointer)0x0;
      local_218._8_8_ = 0;
      local_208._8_8_ = local_218 + 8;
      local_1f8._8_8_ = 0;
      local_268._16_8_ = (_Base_ptr)0x0;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = 0;
      local_268._24_8_ = local_268 + 8;
      local_240 = 0;
      local_248 = (_Base_ptr)local_268._24_8_;
      local_1f8._0_8_ = local_208._8_8_;
      checkElements(iVar4,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                           *)local_298,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)local_218,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_268);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)local_218);
      if (local_298 != (undefined1  [8])0x0) {
        operator_delete((void *)local_298,local_288._M_allocated_capacity - (long)local_298);
      }
      pcVar5 = tinyxml2::XMLNode::Value(&pXVar1->super_XMLNode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_268,pcVar5,(allocator<char> *)local_218);
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268
                      ,"enum");
      if (iVar4 == 0) {
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218,pcVar5,(allocator<char> *)local_298);
        if ((pXVar1->super_XMLNode)._prev == (XMLNode *)0x0) {
          local_220 = (ulong)local_220._4_4_ << 0x20;
        }
        else {
          local_220 = CONCAT44(local_220._4_4_,
                               (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                                             (pXVar1->super_XMLNode)._next != (XMLNode *)0x0));
        }
        std::operator+(&local_198,"struct member array specification is ill-formatted: <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_198,">");
        local_298 = (undefined1  [8])&local_288;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if (paVar11 == paVar7) {
          local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_288._8_8_ = *(long *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_298 = (undefined1  [8])paVar11;
        }
        ppXStack_290 = (XMLElement **)pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError(local_220._0_1_,line,(string *)local_298);
        if (local_298 != (undefined1  [8])&local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = tinyxml2::XMLNode::Value((pXVar1->super_XMLNode)._prev);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_298,pcVar5,(allocator<char> *)&local_198);
        pcVar5 = tinyxml2::XMLNode::Value((pXVar1->super_XMLNode)._next);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,pcVar5,(allocator<char> *)&local_1b8);
        local_1b8._M_dataplus._M_p = (pointer)ppXStack_290;
        local_1b8._M_string_length = (size_type)local_298;
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1b8,"[");
        if (bVar3) {
          local_1b8._M_dataplus._M_p = (pointer)local_198._M_string_length;
          local_1b8._M_string_length = (size_type)local_198._M_dataplus._M_p;
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_1b8,"]");
        }
        else {
          bVar3 = false;
        }
        std::operator+(&local_158,"struct member array specification is ill-formatted: <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158,">");
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if (paVar11 == paVar7) {
          local_1b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_1b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_1b8._M_dataplus._M_p = (pointer)paVar11;
        }
        local_1b8._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError(bVar3,line,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_a8,(value_type *)local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_288._M_allocated_capacity;
        auVar10 = local_298;
        if (local_298 != (undefined1  [8])&local_288) {
LAB_00112113:
          operator_delete((void *)auVar10,(ulong)((long)&((_Base_ptr)uVar9)->_M_color + 1));
        }
LAB_0011211b:
        if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
          operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1));
        }
      }
      else {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_268,"name");
        if (iVar4 == 0) {
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar1);
          local_220 = local_178._M_string_length;
          __len2 = strlen(pcVar5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_178,0,local_220,pcVar5,__len2);
          readModifiers_abi_cxx11_
                    ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_218,(pXVar1->super_XMLNode)._next);
          local_298 = (undefined1  [8])&local_90;
          ppXStack_290 = (XMLElement **)&local_a8;
          std::
          tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
          ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
                       *)local_298,
                      (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1f8 + 8)) {
            operator_delete((void *)local_208._8_8_,local_1f8._8_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_218);
        }
        else {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_268,"type");
          if (iVar4 == 0) {
            readTypeInfo((TypeInfo *)local_218,pXVar1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_128 + 0x20),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
                     );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_e8,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar9 = local_1e8._M_allocated_capacity;
            auVar10 = (undefined1  [8])local_1f8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_ != &local_1e8) goto LAB_00112113;
            goto LAB_0011211b;
          }
        }
      }
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      this_00 = local_138;
      __n = local_178._M_string_length;
      __s2._M_p = local_178._M_dataplus._M_p;
      ppXVar12 = ppXVar12 + 1;
    } while (ppXVar12 != local_130);
    if (local_178._M_string_length != 0) {
      pMVar14 = (local_138->
                super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (local_138->
               super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      do {
        if (pMVar14 == pMVar2) {
LAB_00112270:
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268,"struct member name <",&local_178);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_268,"> already used");
          local_218._0_8_ = (pbVar6->_M_dataplus)._M_p;
          paVar11 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ == paVar11) {
            local_208._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_208._8_8_ = *(long *)((long)&pbVar6->field_2 + 8);
            local_218._0_8_ = local_218 + 0x10;
          }
          else {
            local_208._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_218._8_8_ = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          checkForError(bVar3,line,(string *)local_218);
          if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
            operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_c8,&local_178);
          std::vector<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
          ::push_back(this_00,(value_type *)local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
          MemberData::~MemberData((MemberData *)local_128);
          if (local_238.
              super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (XMLElement **)0x0) {
            operator_delete(local_238.
                            super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_60);
          return;
        }
        if (((pMVar14->name)._M_string_length == __n) &&
           (iVar4 = bcmp((pMVar14->name)._M_dataplus._M_p,__s2._M_p,__n), iVar4 == 0)) {
          bVar3 = false;
          goto LAB_00112270;
        }
        pMVar14 = pMVar14 + 1;
      } while( true );
    }
  }
  __assert_fail("!name.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                ,0x2da,
                "void VideoHppGenerator::readStructMember(const tinyxml2::XMLElement *, std::vector<MemberData> &)"
               );
}

Assistant:

void VideoHppGenerator::readStructMember( tinyxml2::XMLElement const * element, std::vector<MemberData> & members )
{
  (void)members;
  int                                line       = element->GetLineNum();
  std::map<std::string, std::string> attributes = getAttributes( element );
  checkAttributes( line, attributes, {}, {} );
  std::vector<tinyxml2::XMLElement const *> children = getChildElements( element );
  checkElements( line, children, { { "name", true }, { "type", true } }, { "comment", "enum" } );

  MemberData memberData;
  memberData.xmlLine = line;

  std::string name;
  for ( auto child : children )
  {
    int childLine = child->GetLineNum();
    checkAttributes( childLine, getAttributes( child ), {}, {} );
    checkElements( childLine, getChildElements( child ), {}, {} );

    std::string value = child->Value();
    if ( value == "enum" )
    {
      std::string enumString = child->GetText();

      checkForError( child->PreviousSibling() && child->NextSibling(), line, "struct member array specification is ill-formatted: <" + enumString + ">" );
      std::string previous = child->PreviousSibling()->Value();
      std::string next     = child->NextSibling()->Value();
      checkForError( previous.ends_with( "[" ) && next.starts_with( "]" ), line, "struct member array specification is ill-formatted: <" + enumString + ">" );

      memberData.arraySizes.push_back( enumString );
    }
    else if ( value == "name" )
    {
      name                                                   = child->GetText();
      std::tie( memberData.arraySizes, memberData.bitCount ) = readModifiers( child->NextSibling() );
    }
    else if ( value == "type" )
    {
      memberData.type = readTypeInfo( child );
    }
  }
  assert( !name.empty() );

  checkForError(
    std::ranges::none_of( members, [&name]( MemberData const & md ) { return md.name == name; } ), line, "struct member name <" + name + "> already used" );
  memberData.name = name;
  members.push_back( memberData );
}